

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-time.c
# Opt level: O3

int string_to_parts(char *format,char *str,int *year,int *month,int *day,int *hour,int *minute,
                   int *second,int *musec)

{
  char *pcVar1;
  char *pcVar2;
  byte bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  int day_of_year;
  char *pcVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  uint uVar22;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  
  *year = 2000;
  *month = 1;
  *day = 1;
  *hour = 0;
  *minute = 0;
  *second = 0;
  *musec = 0;
  cVar5 = *format;
  iVar11 = 0;
  if (cVar5 != '\0') {
    bVar4 = false;
    uVar14 = 0;
    uVar16 = 0;
    auVar29 = _DAT_001b0260;
    auVar30 = _DAT_001a0f70;
LAB_0015fb6d:
    iVar11 = (int)uVar14;
    uVar16 = (ulong)(int)uVar16;
    while( true ) {
      if ((!bVar4) && (cVar5 == '|')) goto LAB_0016014c;
      if (cVar5 != '\'') goto LAB_0015fb9d;
      cVar5 = format[uVar16 + 1];
      if (cVar5 == '\'') break;
      bVar4 = (bool)(bVar4 ^ 1);
      uVar16 = uVar16 + 1;
      if (cVar5 == '\0') goto LAB_0016012f;
    }
    uVar16 = (ulong)((int)uVar16 + 1);
LAB_0015fb9d:
    iVar7 = (int)uVar16;
    lVar15 = (long)iVar7;
    bVar3 = format[lVar15];
    if (bVar4) {
LAB_0015fbaa:
      if (bVar3 == str[iVar11]) {
        uVar16 = (ulong)(iVar7 + 1);
        uVar14 = (ulong)(iVar11 + 1);
        goto LAB_00160101;
      }
      pcVar12 = "date/time argument (%s) has an incorrect fixed character (format: %s)";
      goto LAB_00160165;
    }
    if (bVar3 < 100) {
      if (0x4c < bVar3) {
        if (bVar3 == 0x4d) {
          if (format[lVar15 + 1] != 'M') goto LAB_001601a0;
          if (format[lVar15 + 2] != 'M') {
            iVar6 = parse_integer(str + iVar11,2,(uint)(format[lVar15 + 2] == '*'),month);
            if (iVar6 == 0) goto LAB_001600a6;
            pcVar12 = "date/time argument (%s) has an incorrect month value (format: %s)";
            goto LAB_00160165;
          }
          iVar6 = coda_month_to_integer(str + iVar11);
          *month = iVar6;
          if (iVar6 == -1) {
            pcVar12 = "date/time argument (%s) has an incorrect month value (format: %s)";
            goto LAB_00160165;
          }
          uVar16 = (ulong)(iVar7 + 3);
          uVar14 = (ulong)(iVar11 + 3);
          auVar29 = _DAT_001b0260;
          auVar30 = _DAT_001a0f70;
        }
        else {
          if (bVar3 != 0x53) goto LAB_00160059;
          lVar9 = 0;
          uVar13 = 1;
          do {
            uVar10 = uVar13;
            lVar8 = lVar9;
            lVar9 = lVar8 + 1;
            uVar13 = uVar10 + 1;
          } while (format[lVar8 + lVar15 + 1] == 'S');
          uVar16 = (uVar16 & 0xffffffff) + lVar9;
          *musec = 0;
          pcVar12 = str + iVar11;
          if (5 < uVar10) {
            uVar10 = 6;
          }
          iVar11 = uVar10 + 1;
          uVar13 = 0;
          do {
            if ((byte)(*pcVar12 - 0x3aU) < 0xf6) {
              pcVar12 = 
              "date/time argument (%s) has an incorrect fractional second value (format: %s)";
              goto LAB_00160165;
            }
            uVar13 = (uint)(byte)(*pcVar12 - 0x30) + uVar13 * 10;
            *musec = uVar13;
            pcVar12 = pcVar12 + 1;
            iVar11 = iVar11 + -1;
          } while (1 < iVar11);
          uVar14 = (uVar14 & 0xffffffff) + lVar9;
          if ((uint)lVar8 < 5) {
            iVar11 = 5 - (int)lVar9;
            auVar21._4_4_ = iVar11;
            auVar21._0_4_ = iVar11;
            auVar21._8_4_ = iVar11;
            auVar21._12_4_ = iVar11;
            uVar22 = 1;
            uVar10 = 1;
            uVar26 = 1;
            iVar11 = 4;
            do {
              uVar20 = uVar26;
              uVar19 = uVar10;
              uVar18 = uVar22;
              uVar17 = uVar13;
              uVar13 = uVar17 * 10;
              uVar10 = uVar19 * 10;
              auVar24._4_4_ = uVar18;
              auVar24._0_4_ = uVar18;
              auVar24._8_4_ = uVar20;
              auVar24._12_4_ = uVar20;
              uVar26 = (uint)((auVar24._8_8_ & 0xffffffff) * 10);
              iVar7 = iVar11 + -4;
              iVar6 = iVar11 + (8 - (uint)lVar8 & 0xc);
              uVar22 = uVar18 * 10;
              iVar11 = iVar7;
            } while (iVar6 != 8);
            iVar7 = -iVar7;
            auVar23._4_4_ = iVar7;
            auVar23._0_4_ = iVar7;
            auVar23._8_4_ = iVar7;
            auVar23._12_4_ = iVar7;
            auVar21 = auVar21 ^ auVar30;
            auVar24 = (auVar23 | auVar29) ^ auVar30;
            uVar22 = -(uint)(auVar21._0_4_ < auVar24._0_4_);
            uVar25 = -(uint)(auVar21._4_4_ < auVar24._4_4_);
            uVar27 = -(uint)(auVar21._8_4_ < auVar24._8_4_);
            uVar28 = -(uint)(auVar21._12_4_ < auVar24._12_4_);
            *musec = (~uVar27 & uVar10 | uVar19 & uVar27) * (~uVar22 & uVar13 | uVar17 & uVar22) *
                     (~uVar25 & uVar18 * 10 | uVar18 & uVar25) *
                     (~uVar28 & uVar26 | uVar20 & uVar28);
          }
        }
LAB_00160101:
        iVar11 = (int)uVar14;
        cVar5 = format[(int)uVar16];
        if (cVar5 == '\0') goto LAB_0016012f;
        goto LAB_0015fb6d;
      }
      if (bVar3 == 0x44) {
        if ((format[lVar15 + 1] == 'D') && (format[lVar15 + 2] == 'D')) {
          pcVar12 = str + iVar11;
          iVar6 = 3;
          if ((format[lVar15 + 3] == '*') && (*pcVar12 == ' ')) {
            pcVar1 = pcVar12 + 1;
            pcVar2 = pcVar12 + 2;
            pcVar12 = pcVar12 + 1;
            if (*pcVar1 == ' ') {
              pcVar12 = pcVar2;
            }
            iVar6 = (*pcVar1 != ' ') + 1;
          }
          iVar6 = iVar6 + 1;
          day_of_year = 0;
          do {
            if ((byte)(*pcVar12 - 0x3aU) < 0xf6) {
              pcVar12 = "date/time argument (%s) has an incorrect day value (format: %s)";
              goto LAB_00160165;
            }
            day_of_year = (uint)(byte)(*pcVar12 - 0x30) + day_of_year * 10;
            pcVar12 = pcVar12 + 1;
            iVar6 = iVar6 + -1;
          } while (1 < iVar6);
          iVar6 = coda_dayofyear_to_month_day(*year,day_of_year,month,day);
          if (iVar6 == 0) {
            uVar16 = (ulong)(iVar7 + (uint)(format[lVar15 + 3] == '*') + 3);
            uVar14 = (ulong)(iVar11 + 3);
            auVar29 = _DAT_001b0260;
            auVar30 = _DAT_001a0f70;
            goto LAB_00160101;
          }
          pcVar12 = "date/time argument (%s) has an invalid day value (format: %s)";
          goto LAB_00160165;
        }
      }
      else {
        if (bVar3 == 0x48) {
          if (format[lVar15 + 1] != 'H') goto LAB_001601a0;
          iVar6 = parse_integer(str + iVar11,2,(uint)(format[lVar15 + 2] == '*'),hour);
          if (iVar6 == 0) goto LAB_001600a6;
          pcVar12 = "date/time argument (%s) has an incorrect hour value (format: %s)";
          goto LAB_00160165;
        }
LAB_00160059:
        if (((0x19 < (byte)(bVar3 + 0xbf)) && (bVar3 != 0x2a)) && (0x19 < (byte)(bVar3 + 0x9f)))
        goto LAB_0015fbaa;
      }
    }
    else if (bVar3 < 0x73) {
      if (bVar3 == 100) {
        if (format[lVar15 + 1] == 'd') {
          iVar6 = parse_integer(str + iVar11,2,(uint)(format[lVar15 + 2] == '*'),day);
          if (iVar6 == 0) {
LAB_001600a6:
            uVar16 = (ulong)(iVar7 + (uint)(format[lVar15 + 2] == '*') + 2);
            uVar14 = (ulong)(iVar11 + 2);
            auVar29 = _DAT_001b0260;
            auVar30 = _DAT_001a0f70;
            goto LAB_00160101;
          }
          pcVar12 = "date/time argument (%s) has an incorrect day value (format: %s)";
          goto LAB_00160165;
        }
      }
      else {
        if (bVar3 != 0x6d) goto LAB_00160059;
        if (format[lVar15 + 1] == 'm') {
          iVar6 = parse_integer(str + iVar11,2,(uint)(format[lVar15 + 2] == '*'),minute);
          if (iVar6 == 0) goto LAB_001600a6;
          pcVar12 = "date/time argument (%s) has an incorrect minute value (format: %s)";
          goto LAB_00160165;
        }
      }
    }
    else if (bVar3 == 0x73) {
      if (format[lVar15 + 1] == 's') {
        iVar6 = parse_integer(str + iVar11,2,(uint)(format[lVar15 + 2] == '*'),second);
        if (iVar6 == 0) goto LAB_001600a6;
        pcVar12 = "date/time argument (%s) has an incorrect second value (format: %s)";
        goto LAB_00160165;
      }
    }
    else {
      if (bVar3 != 0x79) goto LAB_00160059;
      if (((format[lVar15 + 1] == 'y') && (format[lVar15 + 2] == 'y')) &&
         (format[lVar15 + 3] == 'y')) {
        iVar6 = parse_integer(str + iVar11,4,(uint)(format[lVar15 + 4] == '*'),year);
        if (iVar6 == 0) {
          uVar16 = (ulong)(iVar7 + (uint)(format[lVar15] == '*') + 4);
          uVar14 = (ulong)(iVar11 + 4);
          auVar29 = _DAT_001b0260;
          auVar30 = _DAT_001a0f70;
          goto LAB_00160101;
        }
        pcVar12 = "date/time argument (%s) has an incorrect year value (format: %s)";
        goto LAB_00160165;
      }
    }
LAB_001601a0:
    pcVar12 = "unsuppored character sequence in date/time format (%s)";
    goto LAB_0016013b;
  }
LAB_0016014c:
  if (str[iVar11] == '\0') {
    return 0;
  }
  pcVar12 = "date/time argument (%s) contains additional characters (format: %s)";
LAB_00160165:
  coda_set_error(-0x68,pcVar12,str,format);
  return -1;
LAB_0016012f:
  if (bVar4) {
    pcVar12 = "missing closing \' in date/time format (%s)";
LAB_0016013b:
    coda_set_error(-0x67,pcVar12,format);
    return -1;
  }
  goto LAB_0016014c;
}

Assistant:

static int string_to_parts(const char *format, const char *str, int *year, int *month, int *day, int *hour,
                           int *minute, int *second, int *musec)
{
    int use_leading_spaces;
    int format_index = 0;
    int string_index = 0;
    int literal = 0;
    int n;

    /* initialize with epoch 2000-01-01T00:00:00.000000 */
    *year = 2000;
    *month = 1;
    *day = 1;
    *hour = 0;
    *minute = 0;
    *second = 0;
    *musec = 0;

    while (format[format_index] != '\0' && (literal || format[format_index] != '|'))
    {
        if (format[format_index] == '\'')
        {
            format_index++;
            if (format[format_index] != '\'')
            {
                literal = !literal;
                continue;
            }
        }
        if (literal)
        {
            /* literal match */
            if (format[format_index] != str[string_index])
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect fixed character "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index++;
            string_index++;
        }
        else if (format[format_index] == 'y' && format[format_index + 1] == 'y' && format[format_index + 2] == 'y' &&
                 format[format_index + 3] == 'y')
        {
            use_leading_spaces = format[format_index + 4] == '*';
            if (parse_integer(&str[string_index], 4, use_leading_spaces, year) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect year value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 4 + (format[format_index] == '*');
            string_index += 4;
        }
        else if (format[format_index] == 'M' && format[format_index + 1] == 'M')
        {
            if (format[format_index + 2] == 'M')
            {
                /* coda_month_to_integer already limits comparison to only 3 characters */
                *month = coda_month_to_integer(&str[string_index]);
                if (*month == -1)
                {
                    coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect month value "
                                   "(format: %s)", str, format);
                    return -1;
                }
                format_index += 3;
                string_index += 3;
            }
            else
            {
                use_leading_spaces = format[format_index + 2] == '*';
                if (parse_integer(&str[string_index], 2, use_leading_spaces, month) != 0)
                {
                    coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect month value "
                                   "(format: %s)", str, format);
                    return -1;
                }
                format_index += 2 + (format[format_index + 2] == '*');
                string_index += 2;
            }
        }
        else if (format[format_index] == 'd' && format[format_index + 1] == 'd')
        {
            use_leading_spaces = format[format_index + 2] == '*';
            if (parse_integer(&str[string_index], 2, use_leading_spaces, day) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect day value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 2 + (format[format_index + 2] == '*');
            string_index += 2;
        }
        else if (format[format_index] == 'D' && format[format_index + 1] == 'D' && format[format_index + 2] == 'D')
        {
            int day_of_year;

            use_leading_spaces = format[format_index + 3] == '*';
            /* uses currently parsed year value to determine the actual month/day within the year */
            if (parse_integer(&str[string_index], 3, use_leading_spaces, &day_of_year) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect day value "
                               "(format: %s)", str, format);
                return -1;
            }
            if (coda_dayofyear_to_month_day(*year, day_of_year, month, day) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an invalid day value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 3 + (format[format_index + 3] == '*');
            string_index += 3;
        }
        else if (format[format_index] == 'H' && format[format_index + 1] == 'H')
        {
            use_leading_spaces = format[format_index + 2] == '*';
            if (parse_integer(&str[string_index], 2, use_leading_spaces, hour) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect hour value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 2 + (format[format_index + 2] == '*');
            string_index += 2;
        }
        else if (format[format_index] == 'm' && format[format_index + 1] == 'm')
        {
            use_leading_spaces = format[format_index + 2] == '*';
            if (parse_integer(&str[string_index], 2, use_leading_spaces, minute) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect minute value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 2 + (format[format_index + 2] == '*');
            string_index += 2;
        }
        else if (format[format_index] == 's' && format[format_index + 1] == 's')
        {
            use_leading_spaces = format[format_index + 2] == '*';
            if (parse_integer(&str[string_index], 2, use_leading_spaces, second) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect second value "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index += 2 + (format[format_index + 2] == '*');
            string_index += 2;
        }
        else if (format[format_index] == 'S')
        {
            n = 0;
            while (format[format_index] == 'S')
            {
                format_index++;
                n++;
            }
            if (parse_integer(&str[string_index], n > 6 ? 6 : n, 0, musec) != 0)
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect fractional "
                               "second value (format: %s)", str, format);
                return -1;
            }
            string_index += n;
            while (n < 6)
            {
                *musec *= 10;
                n++;
            }
        }
        else if ((format[format_index] >= 'A' && format[format_index] <= 'Z') ||
                 (format[format_index] >= 'a' && format[format_index] <= 'z') || format[format_index] == '*')
        {
            /* reserved character */
            coda_set_error(CODA_ERROR_INVALID_FORMAT, "unsuppored character sequence in date/time format (%s)", format);
            return -1;
        }
        else
        {
            /* literal match */
            if (format[format_index] != str[string_index])
            {
                coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) has an incorrect fixed character "
                               "(format: %s)", str, format);
                return -1;
            }
            format_index++;
            string_index++;
        }
    }
    if (literal)
    {
        coda_set_error(CODA_ERROR_INVALID_FORMAT, "missing closing ' in date/time format (%s)", format);
        return -1;
    }
    if (str[string_index] != '\0')
    {
        coda_set_error(CODA_ERROR_INVALID_DATETIME, "date/time argument (%s) contains additional characters "
                       "(format: %s)", str, format);
        return -1;
    }

    return 0;
}